

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O0

double log(double __x)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  ostream *poVar4;
  string *in_RDX;
  ostream *in_RDI;
  double extraout_XMM0_Qa;
  pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *elem;
  iterator __end1;
  iterator __begin1;
  idx_label_map *__range1;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff68;
  _Self local_60;
  _Self local_58 [2];
  label_idx_map *in_stack_ffffffffffffffb8;
  
  map_by_value(in_stack_ffffffffffffffb8);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(local_58,&local_60);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x105be5);
    poVar3 = std::operator<<(in_RDI,(string *)&ppVar2->second);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = std::operator<<(poVar3,in_RDX);
    poVar4 = (ostream *)std::ostream::operator<<(poVar3,ppVar2->first);
    std::operator<<(poVar4,'\n');
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)poVar3);
  }
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x105bd6);
  return extraout_XMM0_Qa;
}

Assistant:

void log(std::ostream& os, const label_idx_map& labels,
         const std::string& pattern_out) {
    for (auto&& elem : map_by_value(labels)) {
        os << elem.second << " -> " << pattern_out << elem.first << '\n';
    }
}